

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O3

char * rtosc_match_options(char *pattern,char **msg)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar1 = *msg;
  pcVar3 = pcVar1;
  while( true ) {
    cVar2 = pattern[1];
    pattern = pattern + 1;
    if ((cVar2 == '}') || (cVar2 == ',')) break;
    if (*pcVar3 == '\0' || cVar2 != *pcVar3) {
      *msg = pcVar1;
      while( true ) {
        cVar2 = *pattern;
        if (cVar2 == '\0') {
          return (char *)0x0;
        }
        pcVar3 = pcVar1;
        if (cVar2 == ',') break;
        if (cVar2 == '}') {
          return (char *)0x0;
        }
        pattern = pattern + 1;
      }
    }
    else {
      *msg = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    }
  }
  while ((cVar2 != '\0' && (cVar2 != '}'))) {
    pcVar1 = pattern + 1;
    pattern = pattern + 1;
    cVar2 = *pcVar1;
  }
  return pattern + (cVar2 == '}');
}

Assistant:

const char *rtosc_match_options(const char *pattern, const char **msg)
{
    const char *preserve = *msg;
    assert(*pattern == '{');
    pattern++;

retry:

    while(1) {
        //Check for special characters
        if(*pattern == ',' || *pattern == '}') {
            goto advance_until_end;
        } else if((*pattern == **msg)) { //verbatim compare
            if(**msg)
                ++pattern, ++*msg;
            else
                goto try_next;
        } else
            goto try_next;
    }

advance_until_end:
    while(*pattern && *pattern != '}') pattern++;
    if(*pattern == '}')
        pattern++;
    return pattern;
try_next:
    *msg = preserve;
    while(*pattern && *pattern != '}' && *pattern != ',') pattern++;
    if(*pattern == ',') {
        pattern++;
        goto retry;
    }

    return NULL;
}